

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O1

size_t __thiscall r_comp::Metadata::get_size(Metadata *this)

{
  pointer pCVar1;
  pointer pbVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  _Hash_node_base *p_Var7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
  *__range1;
  long lVar8;
  long lVar9;
  Class *c;
  pointer this_00;
  long lVar10;
  string *name;
  long lVar11;
  pointer pbVar12;
  
  pCVar1 = (this->classes_by_opcodes).m_vector.
           super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar11 = 1;
  lVar9 = 1;
  for (this_00 = (this->classes_by_opcodes).m_vector.
                 super__Vector_base<r_comp::Class,_std::allocator<r_comp::Class>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1) {
    sVar3 = Class::get_size(this_00);
    lVar9 = lVar9 + sVar3;
  }
  p_Var7 = (this->classes)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    lVar11 = 1;
    do {
      lVar4 = r_code::GetStringSize((string *)(p_Var7 + 1));
      lVar11 = lVar11 + lVar4 + 1;
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  lVar4 = 1;
  lVar10 = 1;
  for (p_Var7 = (this->sys_classes)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
      p_Var7 = p_Var7->_M_nxt) {
    lVar5 = r_code::GetStringSize((string *)(p_Var7 + 1));
    lVar10 = lVar10 + lVar5 + 1;
  }
  pbVar12 = (this->class_names).m_vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->class_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar2) {
    lVar4 = 1;
    do {
      lVar5 = r_code::GetStringSize((string *)pbVar12);
      lVar4 = lVar4 + lVar5;
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar2);
  }
  pbVar2 = (this->operator_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = 1;
  lVar8 = 1;
  for (pbVar12 = (this->operator_names).m_vector.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2; pbVar12 = pbVar12 + 1
      ) {
    lVar6 = r_code::GetStringSize((string *)pbVar12);
    lVar8 = lVar8 + lVar6;
  }
  pbVar12 = (this->function_names).m_vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->function_names).m_vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar2) {
    lVar5 = 1;
    do {
      lVar6 = r_code::GetStringSize((string *)pbVar12);
      lVar5 = lVar5 + lVar6;
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar2);
  }
  return lVar10 + lVar4 + lVar11 + lVar9 + lVar8 + lVar5;
}

Assistant:

size_t Metadata::get_size()
{
    return get_class_array_size() +
           get_classes_size() +
           get_sys_classes_size() +
           get_class_names_size() +
           get_operator_names_size() +
           get_function_names_size();
}